

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumparray.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  byte bVar2;
  _Setfill<char> _Var3;
  _Setw _Var4;
  ostream *poVar5;
  long lVar6;
  uint local_e24;
  long lStack_e20;
  uint value;
  streamsize i;
  streamsize n;
  int bytesInLine;
  int maxBytesInLine;
  char buffer [2391];
  ostream local_4a8 [8];
  ofstream fout;
  long local_2a8;
  ifstream fin;
  allocator local_99;
  string local_98 [8];
  string arrayName;
  allocator local_71;
  string local_70 [8];
  string headerFilename;
  allocator local_39;
  string local_38 [8];
  string sourceFilename;
  char **argv_local;
  int argc_local;
  
  if (argc == 4) {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,pcVar1,&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    pcVar1 = argv[2];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,pcVar1,&local_71);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    pcVar1 = argv[3];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,pcVar1,&local_99);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    std::ifstream::ifstream(&local_2a8,local_38,_S_bin);
    std::ofstream::ofstream(local_4a8,local_70,_S_out);
    bVar2 = std::ios::operator!((ios *)((long)&local_2a8 + *(long *)(local_2a8 + -0x18)));
    if ((bVar2 & 1) == 0) {
      poVar5 = std::operator<<(local_4a8,"#include <cstddef>");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(local_4a8,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(local_4a8,"static const char ");
      poVar5 = std::operator<<(poVar5,local_98);
      poVar5 = std::operator<<(poVar5,"[] = {");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      n._0_4_ = 0;
      do {
        std::istream::read((char *)&local_2a8,(long)&bytesInLine);
        lVar6 = std::istream::gcount();
        for (lStack_e20 = 0; lStack_e20 < lVar6; lStack_e20 = lStack_e20 + 1) {
          local_e24 = (uint)*(char *)((long)&bytesInLine + lStack_e20);
          if (0xff < local_e24) {
            local_e24 = local_e24 + 0x100;
          }
          if (0x7f < local_e24) {
            std::operator<<(local_4a8,"-");
            local_e24 = 0x100 - local_e24;
          }
          poVar5 = std::operator<<(local_4a8,"0x");
          _Var4 = std::setw(2);
          poVar5 = std::operator<<(poVar5,_Var4);
          _Var3 = std::setfill<char>('0');
          poVar5 = std::operator<<(poVar5,_Var3._M_c);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::hex);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_e24);
          std::operator<<(poVar5,", ");
          n._0_4_ = (int)n + 1;
          if ((int)n == 0x14) {
            std::ostream::operator<<(local_4a8,std::endl<char,std::char_traits<char>>);
            n._0_4_ = 0;
          }
        }
      } while (0 < lVar6);
      if (0 < (int)n) {
        std::ostream::operator<<(local_4a8,std::endl<char,std::char_traits<char>>);
      }
      poVar5 = std::operator<<(local_4a8,"};");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(local_4a8,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(local_4a8,"size_t ");
      poVar5 = std::operator<<(poVar5,local_98);
      poVar5 = std::operator<<(poVar5,"_length = sizeof(");
      poVar5 = std::operator<<(poVar5,local_98);
      poVar5 = std::operator<<(poVar5,") / sizeof(char);");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::ifstream::close();
      std::ofstream::close();
      argv_local._4_4_ = 0;
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Can\'t open file ");
      poVar5 = std::operator<<(poVar5,local_38);
      poVar5 = std::operator<<(poVar5,"!");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 1;
    }
    stack0xfffffffffffffb54 = 1;
    std::ofstream::~ofstream(local_4a8);
    std::ifstream::~ifstream(&local_2a8);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_38);
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar5 = std::operator<<(poVar5,*argv);
    poVar5 = std::operator<<(poVar5," <sourceFile> <headerFile> <arrayName>");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
    if (argc != 4) {
        std::cerr << "Usage: " << argv[0] << " <sourceFile> <headerFile> <arrayName>" << std::endl;
        return 1;
    }

    std::string sourceFilename(argv[1]);
    std::string headerFilename(argv[2]);
    std::string arrayName(argv[3]);

    std::ifstream fin(sourceFilename, std::ios::binary);
    std::ofstream fout(headerFilename);

    if (!fin) {
        std::cerr << "Can't open file " << sourceFilename << "!" << std::endl;
        return 1;
    }

    // #include <cstddef>
    //
    // static const char <arrayName>[] = {
    //  /*... hexadecimal data from source file ...*/
    // };
    //
    // size_t <arrayName>_length = sizeof(<arrayName>) / sizeof(char);

    fout << "#include <cstddef>" << std::endl;
    fout << std::endl;
    fout << "static const char " << arrayName << "[] = {" << std::endl;

    char buffer[2391];
    const int maxBytesInLine = 120 / 6;
    int bytesInLine = 0;

    std::streamsize n;
    do {
        fin.read(buffer, sizeof(buffer) / sizeof(char));
        n = fin.gcount();
        for (std::streamsize i = 0; i < n; ++i) {
            unsigned int value = (unsigned int) buffer[i];
            if (value > 0xff) {
                value -= 0xffffff00;
            }
            if (value >= 128) {
                fout << "-";
                value = 256 - value;
            }
            fout << "0x" << std::setw(2) << std::setfill('0') << std::hex << value << ", ";
            ++bytesInLine;
            if (bytesInLine == maxBytesInLine) {
                fout << std::endl;
                bytesInLine = 0;
            }
        }
    } while (n > 0);

    if (bytesInLine > 0)
        fout << std::endl;

    fout << "};" << std::endl;
    fout << std::endl;
    fout << "size_t " << arrayName << "_length = sizeof(" << arrayName << ") / sizeof(char);" << std::endl;

    fin.close();
    fout.close();

    return 0;
}